

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_manager.c
# Opt level: O0

int check_mm_table_is_newer(mm_context_t *context,char *terminal_id,uint8_t table_id)

{
  int iVar1;
  undefined1 local_4a0 [8];
  tm ptm;
  char table_mtime_date [100];
  char local_3f8 [8];
  char last_download_date [100];
  undefined1 local_388 [8];
  stat last_download_time_attr;
  stat table_mtime_attr;
  char download_time_fname [284];
  char fname [283];
  uint8_t table_id_local;
  char *terminal_id_local;
  mm_context_t *context_local;
  
  memset(local_4a0,0,0x38);
  if (*terminal_id == '\0') {
    table_mtime_attr.st_atim.tv_nsec = 0;
    last_download_time_attr.st_atim.tv_nsec = 0;
  }
  else {
    snprintf(download_time_fname + 0x118,0x11b,"%s/%s/mm_table_%02x.bin",context->term_table_dir,
             terminal_id,(ulong)table_id);
    snprintf((char *)(table_mtime_attr.__glibc_reserved + 2),0x11c,"%s/%s/table_update.log",
             context->term_table_dir,terminal_id);
    iVar1 = stat(download_time_fname + 0x118,(stat *)(last_download_time_attr.__glibc_reserved + 2))
    ;
    if (iVar1 == -1) {
      snprintf(download_time_fname + 0x118,0x11b,"%s/mm_table_%02x.bin",context->default_table_dir,
               (ulong)table_id);
      iVar1 = stat(download_time_fname + 0x118,
                   (stat *)(last_download_time_attr.__glibc_reserved + 2));
      if (iVar1 == -1) {
        table_mtime_attr.st_atim.tv_nsec = 0;
      }
    }
    iVar1 = stat((char *)(table_mtime_attr.__glibc_reserved + 2),(stat *)local_388);
    if (iVar1 == -1) {
      last_download_time_attr.st_atim.tv_nsec = 0;
    }
  }
  localtime_r(&last_download_time_attr.st_atim.tv_nsec,(tm *)local_4a0);
  strftime(local_3f8,99,"%Y-%m-%d %H:%M:%S",(tm *)local_4a0);
  localtime_r(&table_mtime_attr.st_atim.tv_nsec,(tm *)local_4a0);
  strftime((char *)&ptm.tm_zone,99,"%Y-%m-%d %H:%M:%S",(tm *)local_4a0);
  if (table_mtime_attr.st_atim.tv_nsec < last_download_time_attr.st_atim.tv_nsec) {
    printf("Skipping download of table %d: last downloaded: %s, mtime: %s.\n",(ulong)table_id,
           local_3f8,&ptm.tm_zone);
    context_local._4_4_ = -1;
  }
  else {
    context_local._4_4_ = 0;
  }
  return context_local._4_4_;
}

Assistant:

static int check_mm_table_is_newer(mm_context_t *context, char *terminal_id, uint8_t table_id) {
    char  fname[TABLE_PATH_MAX_LEN];
    char  download_time_fname[TABLE_PATH_MAX_LEN + 1];
    struct stat table_mtime_attr;
    struct stat last_download_time_attr;

    char  last_download_date[100];
    char  table_mtime_date[100];

    struct tm ptm = { 0 };

    if (terminal_id[0] != '\0') {
        snprintf(fname, sizeof(fname), "%s/%s/mm_table_%02x.bin", context->term_table_dir, terminal_id, table_id);
        snprintf(download_time_fname, sizeof(download_time_fname), "%s/%s/table_update.log", context->term_table_dir, terminal_id);
        if (stat(fname, &table_mtime_attr) == -1) {
            snprintf(fname, sizeof(fname), "%s/mm_table_%02x.bin", context->default_table_dir, table_id);
            if (stat(fname, &table_mtime_attr) == -1) {
                table_mtime_attr.st_mtime = 0;
            }
        }

        if (stat(download_time_fname, &last_download_time_attr) == -1) {
            last_download_time_attr.st_mtime = 0;
        }
    } else {
        table_mtime_attr.st_mtime = 0;
        last_download_time_attr.st_mtime = 0;
    }

    localtime_r(&last_download_time_attr.st_mtime, &ptm);
    strftime(last_download_date, 99, "%Y-%m-%d %H:%M:%S", &ptm);

    localtime_r(&table_mtime_attr.st_mtime, &ptm);
    strftime(table_mtime_date, 99, "%Y-%m-%d %H:%M:%S", &ptm);

    if (table_mtime_attr.st_mtime < last_download_time_attr.st_mtime) {
        printf("Skipping download of table %d: last downloaded: %s, mtime: %s.\n",
            table_id,
            last_download_date,
            table_mtime_date);
            return -1;
    }
    return 0;
}